

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::SetWhat<char_const*&,char,int&,char,char_const(&)[45]>
          (Exception *this,char **args,char *args_1,int *args_2,char *args_3,char (*args_4) [45])

{
  string *in_RDI;
  char *in_R9;
  ostringstream oss;
  int *in_stack_fffffffffffffe10;
  ostringstream *this_00;
  ostringstream *in_stack_fffffffffffffe28;
  Exception *in_stack_fffffffffffffe30;
  char (*in_stack_fffffffffffffe40) [45];
  ostringstream local_1a8 [376];
  char *local_30;
  
  this_00 = local_1a8;
  local_30 = in_R9;
  std::__cxx11::ostringstream::ostringstream(this_00);
  SetWhat<char_const*&,char,int&,char,char_const(&)[45]>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(char **)this_00,(char *)in_RDI,
             in_stack_fffffffffffffe10,local_30,in_stack_fffffffffffffe40);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=(in_RDI,(string *)&stack0xfffffffffffffe28);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void SetWhat(Args&&... args)
        {
            std::ostringstream oss;
            SetWhat(oss, std::forward<Args>(args)...);
            what_ = oss.str();
        }